

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_> *
kj::parse::
Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
::
Impl<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
::apply(Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
        *__return_storage_ptr__,
       ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
       *subParser,
       IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
       *input)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar4;
  char cVar5;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar6;
  size_t newSize;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  subInput;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_e8;
  char local_c8;
  OrphanBuilder local_c0;
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_> *local_a0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *local_98;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  *local_90;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_88;
  Reader *local_78;
  undefined8 uStack_70;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_68;
  char local_58 [8];
  uint64_t local_50;
  SegmentBuilder *local_48;
  CapTableBuilder *pCStack_40;
  word *local_38;
  
  local_e8.builder.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_e8.builder.pos = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_e8.builder.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_e8.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_98 = &input->end;
  local_a0 = __return_storage_ptr__;
  do {
    if ((input->pos).index == (input->end).index) break;
    local_88.container = (input->pos).container;
    local_88.index = (input->pos).index;
    local_88._12_4_ = *(undefined4 *)&(input->pos).field_0xc;
    local_78 = local_98->container;
    uStack_70 = *(undefined8 *)&local_98->index;
    local_68.container._0_4_ = *(undefined4 *)&(input->pos).container;
    local_68.container._4_4_ = *(undefined4 *)((long)&(input->pos).container + 4);
    local_68.index = (input->pos).index;
    local_68._12_4_ = *(undefined4 *)&(input->pos).field_0xc;
    local_90 = input;
    (*(code *)**(undefined8 **)subParser->wrapper)
              (local_58,subParser->wrapper,subParser->parser,&local_90);
    cVar5 = local_58[0];
    local_c8 = local_58[0];
    if (local_58[0] == '\x01') {
      local_c0.segment = local_48;
      local_c0.capTable = pCStack_40;
      local_c0.location = local_38;
      local_c0.tag.content = local_50;
      (local_90->pos).index = local_88.index;
      (local_90->pos).container = local_88.container;
      if (local_e8.builder.pos == local_e8.builder.endPtr) {
        newSize = (long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4;
        if (local_e8.builder.pos == local_e8.builder.ptr) {
          newSize = 4;
        }
        Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::setCapacity
                  (&local_e8,newSize);
      }
      ((local_e8.builder.pos)->builder).segment = local_c0.segment;
      ((local_e8.builder.pos)->builder).capTable = local_c0.capTable;
      ((local_e8.builder.pos)->builder).location = local_c0.location;
      ((local_e8.builder.pos)->builder).tag.content = local_c0.tag.content;
      local_e8.builder.pos = local_e8.builder.pos + 1;
    }
    else if ((local_58[0] != '\0') && (local_c0.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&local_c0);
    }
    if (local_90 !=
        (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
         *)0x0) {
      uVar2 = local_68.index;
      pIVar4 = &local_68;
      if (local_68.index < local_88.index) {
        uVar2 = local_88.index;
        pIVar4 = &local_88;
      }
      uVar1 = (local_90->best).index;
      uVar3 = uVar2;
      if (uVar2 <= uVar1) {
        uVar3 = uVar1;
      }
      pIVar6 = &local_90->best;
      if (uVar1 < uVar2) {
        pIVar6 = pIVar4;
      }
      (local_90->best).container = pIVar6->container;
      (local_90->best).index = uVar3;
    }
  } while (cVar5 != '\0');
  if (local_e8.builder.pos != local_e8.builder.endPtr) {
    Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::setCapacity
              (&local_e8,(long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 5);
  }
  (local_a0->ptr).isSet = true;
  (local_a0->ptr).field_1.value.ptr = local_e8.builder.ptr;
  (local_a0->ptr).field_1.value.size_ = (long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 5
  ;
  (local_a0->ptr).field_1.value.disposer = local_e8.builder.disposer;
  return local_a0;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }